

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::InitDefaultsImpl(void)

{
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
            );
  internal::InitProtobufDefaults();
  protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  _Version_default_instance_ = &PTR__Version_00426df0;
  _DAT_0042fbe8 = 0;
  uRam000000000042fbf0 = 0;
  _DAT_0042fbf8 = &internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_0042fc00 = 0;
  _DAT_0042fc08 = 0;
  DAT_0042fc10 = 1;
  _CodeGeneratorRequest_default_instance_ = &PTR__CodeGeneratorRequest_00426ec0;
  _DAT_0042fc20 = 0;
  uRam000000000042fc28 = 0;
  _DAT_0042fc30 = 0;
  uRam000000000042fc38 = 0;
  _DAT_0042fc40 = 0;
  uRam000000000042fc48 = 0;
  _DAT_0042fc50 = 0;
  uRam000000000042fc58 = 0;
  _DAT_0042fc60 = &internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0042fc70 = 1;
  _CodeGeneratorResponse_File_default_instance_ = &PTR__CodeGeneratorResponse_File_00426f90;
  _DAT_0042fc80 = 0;
  uRam000000000042fc88 = 0;
  _DAT_0042fc90 = &internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_0042fc98 = &internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_0042fca0 = &internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0042fca8 = 1;
  _CodeGeneratorResponse_default_instance_ = &PTR__CodeGeneratorResponse_00427060;
  _DAT_0042fcd8 = 0;
  _DAT_0042fcc8 = 0;
  uRam000000000042fcd0 = 0;
  _DAT_0042fcb8 = 0;
  uRam000000000042fcc0 = 0;
  _DAT_0042fce0 = &internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0042fce8 = 1;
  _DAT_0042fc68 = &_Version_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  _Version_default_instance_.DefaultConstruct();
  _CodeGeneratorRequest_default_instance_.DefaultConstruct();
  _CodeGeneratorResponse_File_default_instance_.DefaultConstruct();
  _CodeGeneratorResponse_default_instance_.DefaultConstruct();
  _CodeGeneratorRequest_default_instance_.get_mutable()->compiler_version_ = const_cast< ::google::protobuf::compiler::Version*>(
      ::google::protobuf::compiler::Version::internal_default_instance());
}